

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

bool jsonip::parser::cirange_<(char)48,(char)57>::
     match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  bool bVar1;
  char cVar2;
  char c;
  ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state_local;
  
  bVar1 = ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::at_end(state);
  if (bVar1) {
    state_local._7_1_ = false;
  }
  else {
    cVar2 = ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::char_at_pos(state);
    if ((cVar2 < '0') || ('9' < cVar2)) {
      state_local._7_1_ = false;
    }
    else {
      ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::advance(state);
      state_local._7_1_ = true;
    }
  }
  return state_local._7_1_;
}

Assistant:

static inline bool match(S& state)
        {
            if (state.at_end()) return false;

            char c = state.char_at_pos();
            if (c >= c1 && c <= c2)
            {
                state.advance();
                return true;
            }
            return false;
        }